

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fLightAmountTest.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::LightAmountCase::iterate(LightAmountCase *this)

{
  deUint64 *this_00;
  undefined *__s;
  bool bVar1;
  GLenum GVar2;
  deUint32 program_00;
  RenderContext *renderCtx;
  TestLog *log;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  char *local_500;
  char *local_470;
  undefined1 local_458 [7];
  bool testOk;
  undefined1 local_388 [8];
  ShaderProgram program;
  string local_298;
  _Base_ptr local_278;
  undefined1 local_270;
  string local_268;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  _Base_ptr local_208;
  undefined1 local_200;
  string local_1f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  _Base_ptr local_198;
  undefined1 local_190;
  string local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  undefined1 local_128 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_f0;
  undefined1 local_d0 [8];
  StringTemplate fragmentTemplate;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  StringTemplate vertexTemplate;
  undefined1 local_50 [7];
  bool hasAnyLights;
  string fragmentShaderSource;
  string vertexShaderSource;
  LightAmountCase *this_local;
  
  GVar2 = glwGetError();
  glu::checkError(GVar2,"LightAmountTest::iterate() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fLightAmountTest.cpp"
                  ,0x94);
  std::__cxx11::string::string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  vertexTemplate.m_template.field_2._M_local_buf[0xf] =
       this->m_numDirectionalLights + this->m_numOmniLights + this->m_numSpotLights != 0;
  if ((bool)vertexTemplate.m_template.field_2._M_local_buf[0xf]) {
    local_470 = s_vertexShaderTemplate;
  }
  else {
    local_470 = s_noLightsVertexShader;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,local_470,&local_99);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  __s = s_fragmentShaderTemplate;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,__s,
             (allocator<char> *)((long)&params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_128);
  de::toString<int>(&local_188,&this->m_numDirectionalLights);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_168,(char (*) [15])"NUM_DIR_LIGHTS",&local_188);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_128,&local_168);
  local_198 = (_Base_ptr)_Var3.first._M_node;
  local_190 = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  de::toString<int>(&local_1f8,&this->m_numOmniLights);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1d8,(char (*) [16])"NUM_OMNI_LIGHTS",&local_1f8);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_128,&local_1d8);
  local_208 = (_Base_ptr)_Var3.first._M_node;
  local_200 = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  de::toString<int>(&local_268,&this->m_numSpotLights);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_248,(char (*) [16])"NUM_SPOT_LIGHTS",&local_268);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_128,&local_248);
  local_278 = (_Base_ptr)_Var3.first._M_node;
  local_270 = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  tcu::StringTemplate::specialize
            (&local_298,(StringTemplate *)local_78,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_128);
  std::__cxx11::string::operator=
            ((string *)(fragmentShaderSource.field_2._M_local_buf + 8),(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  tcu::StringTemplate::specialize
            ((string *)&program.m_program.m_info.linkTimeUs,(StringTemplate *)local_d0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_128);
  this_00 = &program.m_program.m_info.linkTimeUs;
  std::__cxx11::string::operator=((string *)local_50,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_128);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_d0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_78);
  renderCtx = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  glu::makeVtxFragSources
            ((ProgramSources *)local_458,(string *)((long)&fragmentShaderSource.field_2 + 8),
             (string *)local_50);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_388,renderCtx,(ProgramSources *)local_458);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_458);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,(ShaderProgram *)local_388);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_388);
  glwUseProgram(program_00);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_388);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"LightAmountTest::iterate() end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fLightAmountTest.cpp"
                  ,0xb2);
  if (bVar1) {
    local_500 = "Pass";
  }
  else {
    local_500 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,local_500);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_388);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
  return STOP;
}

Assistant:

TestCase::IterateResult LightAmountCase::iterate (void)
{
	GLU_CHECK_MSG("LightAmountTest::iterate() begin");

	string vertexShaderSource;
	string fragmentShaderSource;

	// Fill in shader template parameters.
	{
		bool hasAnyLights = ((m_numDirectionalLights + m_numOmniLights + m_numSpotLights) != 0);

		tcu::StringTemplate vertexTemplate(hasAnyLights ? s_vertexShaderTemplate : s_noLightsVertexShader);
		tcu::StringTemplate fragmentTemplate(s_fragmentShaderTemplate);

		map<string, string> params;
		params.insert(pair<string, string>("NUM_DIR_LIGHTS", de::toString(m_numDirectionalLights)));
		params.insert(pair<string, string>("NUM_OMNI_LIGHTS", de::toString(m_numOmniLights)));
		params.insert(pair<string, string>("NUM_SPOT_LIGHTS", de::toString(m_numSpotLights)));

		vertexShaderSource		= vertexTemplate.specialize(params);
		fragmentShaderSource	= fragmentTemplate.specialize(params);
	}

	// Create shader and program objects.
	glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	m_testCtx.getLog() << program;

	// Draw something? Check results?
	glUseProgram(program.getProgram());

	bool testOk = program.isOk();

	GLU_CHECK_MSG("LightAmountTest::iterate() end");

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, testOk ? "Pass" : "Fail");
	return TestCase::STOP;
}